

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cpp
# Opt level: O0

uint64_t bidfx_public_api::tools::Varint::ReadU64(InputStream *stream)

{
  bool bVar1;
  uint uVar2;
  int local_1c;
  uchar next_byte;
  ulong uStack_18;
  int offset;
  unsigned_long_long result;
  InputStream *stream_local;
  
  uStack_18 = 0;
  local_1c = 0;
  while( true ) {
    if (0x3f < local_1c) {
      return uStack_18;
    }
    uVar2 = (**stream->_vptr_InputStream)();
    uStack_18 = (long)(int)(uVar2 & 0x7f) << ((byte)local_1c & 0x3f) | uStack_18;
    bVar1 = IsFinalByte(uVar2 & 0xff);
    if (bVar1) break;
    local_1c = local_1c + 7;
  }
  return uStack_18;
}

Assistant:

uint64_t Varint::ReadU64(InputStream& stream)
{
    unsigned long long result = 0L;
    for (int offset = 0; offset < 64; offset += kBitsPerByte)
    {
        unsigned char next_byte = stream.ReadByte();
        result |= (unsigned long long) (next_byte & kMaskLow7Bits) << offset;
        if (IsFinalByte(next_byte))
        {
            break;
        }
    }
    return result;
}